

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

void get_max_cover_static2<576ul,6>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  array<unsigned_long,_6UL> *collection;
  pointer paVar7;
  size_t j;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  size_t N;
  size_type n;
  size_t progress;
  size_t this_count;
  vector<std::bitset<576UL>,_std::allocator<std::bitset<576UL>_>_> binary_sets;
  collection end;
  collection indices;
  ulong local_128;
  size_type local_120;
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>_>
  local_118;
  size_type local_f8;
  unsigned_long local_f0;
  size_t local_e8;
  vector<std::bitset<576UL>,_std::allocator<std::bitset<576UL>_>_> local_e0;
  anon_class_56_7_64ceefa5 local_c8;
  collection local_90;
  collection local_60;
  
  BitSetsFromSets<576ul>(&local_e0,sets,names);
  local_120 = ((long)(sets->
                     super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(sets->
                     super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  auVar11 = vpbroadcastq_avx512f();
  auVar11 = vpaddq_avx512f(auVar11,_DAT_0019bf80);
  uVar5 = 1;
  auVar12 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar11._48_8_ = auVar12._48_8_;
  auVar11._56_8_ = auVar12._56_8_;
  auVar10 = vextracti64x4_avx512f(auVar11,1);
  auVar11 = vpmullq_avx512dq(auVar11,ZEXT3264(auVar10));
  auVar8 = vpmullq_avx512vl(auVar11._0_16_,auVar11._16_16_);
  auVar9 = vpshufd_avx(auVar8,0xee);
  auVar9 = vpmullq_avx512vl(auVar8,auVar9);
  local_128 = auVar9._0_8_;
  do {
    local_128 = local_128 / uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 7);
  lVar6 = 0;
  puVar1 = (_begin->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (_end->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    local_60._M_elems[lVar6] = puVar1[lVar6];
    local_90._M_elems[lVar6] = puVar2[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  local_c8.indices = &local_60;
  local_c8.best = &local_118;
  local_c8.this_count = &local_e8;
  local_c8.progress = &local_f0;
  local_c8.end = &local_90;
  local_c8.n = &local_120;
  local_118.first = 0;
  local_118.second.
  super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.second.
  super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.second.
  super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = (names->_M_h)._M_element_count;
  local_c8.binary_sets = &local_e0;
  ProgressIndicator<std::exception,get_max_cover_static2<576ul,6>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",print_progress,&local_c8,&(local_c8.best)->first,&local_f8,
             local_c8.progress,&local_128);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_c8.indices._0_1_ = 0x2f;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_c8,1);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar3 = local_118.second.
           super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_118.second.
      super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_118.second.
      super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar7 = local_118.second.
             super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar6 = 1;
      do {
        local_c8.indices._0_1_ = 9;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_c8,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      local_c8.indices._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_c8,1);
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar3);
  }
  if (local_118.second.
      super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.second.
                    super__Vector_base<std::array<unsigned_long,_6UL>,_std::allocator<std::array<unsigned_long,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<std::bitset<576UL>,_std::allocator<std::bitset<576UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::bitset<576UL>,_std::allocator<std::bitset<576UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}